

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die_deliv.c
# Opt level: O3

int dwarf_child(Dwarf_Die die,Dwarf_Die *caller_ret_die,Dwarf_Error *error)

{
  Dwarf_CU_Context_conflict context;
  Dwarf_Byte_Ptr pDVar1;
  Dwarf_Abbrev_List_conflict pDVar2;
  Dwarf_Unsigned v;
  int iVar3;
  Dwarf_Die die_00;
  Dwarf_Small *pDVar4;
  char *msg;
  Dwarf_Byte_Ptr pDVar5;
  Dwarf_Signed errval;
  Dwarf_Debug dbg;
  Dwarf_Bool has_die_child;
  Dwarf_Byte_Ptr local_80;
  long local_78;
  Dwarf_Unsigned highest_code;
  Dwarf_Unsigned utmp;
  Dwarf_Byte_Ptr die_info_ptr2;
  Dwarf_Small *local_58;
  dwarfstring m;
  
  die_info_ptr2 = (Dwarf_Byte_Ptr)0x0;
  has_die_child = 0;
  utmp = 0;
  highest_code = 0;
  if (die == (Dwarf_Die)0x0) {
    errval = 0x34;
  }
  else {
    context = die->di_cu_context;
    if (context != (Dwarf_CU_Context_conflict)0x0) {
      dbg = context->cc_dbg;
      if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
        _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                            "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
                           );
        return 1;
      }
      local_78 = 0x40;
      if (die->di_is_info == 0) {
        local_78 = 0x70;
      }
      pDVar1 = die->di_debug_ptr;
      *(Dwarf_Die *)((long)&dbg->de_path + local_78) = die;
      *(Dwarf_Byte_Ptr *)((long)&dbg->de_fd + local_78) = pDVar1;
      if (*pDVar1 == '\0') {
        return -1;
      }
      local_80 = _dwarf_calculate_info_section_end_ptr(context);
      iVar3 = _dwarf_next_die_info_ptr
                        (pDVar1,die->di_cu_context,local_80,(Dwarf_Byte_Ptr)0x0,0,&has_die_child,
                         &die_info_ptr2,error);
      pDVar5 = die_info_ptr2;
      if (iVar3 != 0) {
        return iVar3;
      }
      if (pDVar1 == local_80) {
        return -1;
      }
      local_58 = die_info_ptr2;
      *(Dwarf_Byte_Ptr *)((long)&dbg->de_fd + local_78) = die_info_ptr2;
      if (has_die_child == 0) {
        if (local_80 <= die_info_ptr2) {
          return -1;
        }
        do {
          if (*die_info_ptr2 != '\0') {
            return -1;
          }
          die_info_ptr2 = die_info_ptr2 + 1;
          *(Dwarf_Byte_Ptr *)((long)&dbg->de_fd + local_78) = die_info_ptr2;
        } while (die_info_ptr2 != local_80);
        return -1;
      }
      die_00 = (Dwarf_Die)_dwarf_get_alloc(dbg,'\b',1);
      if (die_00 != (Dwarf_Die)0x0) {
        die_00->di_debug_ptr = pDVar5;
        die_00->di_cu_context = die->di_cu_context;
        die_00->di_is_info = die->di_is_info;
        iVar3 = _dwarf_leb128_uword_wrapper(dbg,&local_58,local_80,&utmp,error);
        v = utmp;
        if (iVar3 == 0) {
          *(Dwarf_Small **)((long)&dbg->de_fd + local_78) = local_58;
          if (utmp == 0) {
            pDVar4 = local_58;
            if (local_58 < local_80) {
              do {
                if (*pDVar4 != '\0') break;
                pDVar4 = pDVar4 + 1;
                *(Dwarf_Small **)((long)&dbg->de_fd + local_78) = pDVar4;
              } while (pDVar4 != local_80);
            }
            *caller_ret_die = (Dwarf_Die)0x0;
            dwarf_dealloc(dbg,die_00,8);
            return -1;
          }
          die_00->di_abbrev_code = utmp;
          iVar3 = _dwarf_get_abbrev_for_code
                            (die_00->di_cu_context,utmp,&die_00->di_abbrev_list,&highest_code,error)
          ;
          if (iVar3 == -1) {
            dwarfstring_constructor(&m);
            dwarf_dealloc_die(die_00);
            dwarfstring_append_printf_u
                      (&m,
                       "DW_DLE_ABBREV_MISSING: the abbrev code not found  in dwarf_child() is %u. ",
                       v);
            dwarfstring_append_printf_u
                      (&m,"The highest known code in any compilation unit is %u.",highest_code);
            msg = dwarfstring_string(&m);
            _dwarf_error_string(dbg,error,0x18a,msg);
            dwarfstring_destructor(&m);
            return 1;
          }
          if (iVar3 == 1) {
            dwarf_dealloc(dbg,die_00,8);
            return 1;
          }
          pDVar2 = die_00->di_abbrev_list;
          if (pDVar2->abl_attr == (Dwarf_Half *)0x0) {
            pDVar1 = pDVar2->abl_abbrev_ptr;
            pDVar5 = _dwarf_calculate_abbrev_section_end_ptr(die_00->di_cu_context);
            iVar3 = _dwarf_fill_in_attr_form_abtable
                              (die_00->di_cu_context,pDVar1,pDVar5,die_00->di_abbrev_list,error);
            if (iVar3 != 0) goto LAB_001563c1;
          }
          *caller_ret_die = die_00;
          return 0;
        }
LAB_001563c1:
        dwarf_dealloc_die(die_00);
        return iVar3;
      }
      errval = 0x3e;
      goto LAB_001563ee;
    }
    errval = 0x68;
  }
  dbg = (Dwarf_Debug)0x0;
LAB_001563ee:
  _dwarf_error(dbg,error,errval);
  return 1;
}

Assistant:

int
dwarf_child(Dwarf_Die die,
    Dwarf_Die * caller_ret_die,
    Dwarf_Error * error)
{
    Dwarf_Byte_Ptr die_info_ptr = 0;
    Dwarf_Byte_Ptr die_info_ptr2 = 0;

    /* die_info_end points one-past-end of die area. */
    Dwarf_Byte_Ptr die_info_end = 0;
    Dwarf_Die ret_die = 0;
    Dwarf_Bool has_die_child = 0;
    Dwarf_Debug dbg;
    Dwarf_Unsigned abbrev_code = 0;
    Dwarf_Unsigned utmp = 0;
    Dwarf_Debug_InfoTypes dis = 0;
    int res = 0;
    Dwarf_CU_Context context = 0;
    int lres = 0;
    Dwarf_Unsigned highest_code = 0;

    CHECK_DIE(die, DW_DLV_ERROR);
    dbg = die->di_cu_context->cc_dbg;
    dis = die->di_is_info? &dbg->de_info_reading:
        &dbg->de_types_reading;
    die_info_ptr = die->di_debug_ptr;

    /*  We are saving a DIE pointer here, but the pointer
        will not be presumed live later, when it is tested. */
    dis->de_last_die = die;
    dis->de_last_di_ptr = die_info_ptr;

    /* NULL die has no child. */
    if ((*die_info_ptr) == 0) {
        return DW_DLV_NO_ENTRY;
    }
    context = die->di_cu_context;
    die_info_end = _dwarf_calculate_info_section_end_ptr(context);

    res = _dwarf_next_die_info_ptr(die_info_ptr,
        die->di_cu_context,
        die_info_end,
        NULL, FALSE,
        &has_die_child,
        &die_info_ptr2,
        error);
    if (res != DW_DLV_OK) {
        return res;
    }
    if (die_info_ptr == die_info_end) {
        return DW_DLV_NO_ENTRY;
    }
    die_info_ptr = die_info_ptr2;

    dis->de_last_di_ptr = die_info_ptr;

    if (!has_die_child) {
        /* Look for end of sibling chain. */
        while (dis->de_last_di_ptr < die_info_end) {
            if (*dis->de_last_di_ptr) {
                break;
            }
            ++dis->de_last_di_ptr;
        }
        return DW_DLV_NO_ENTRY;
    }

    ret_die = (Dwarf_Die) _dwarf_get_alloc(dbg, DW_DLA_DIE, 1);
    if (!ret_die) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }
    ret_die->di_debug_ptr = die_info_ptr;
    ret_die->di_cu_context = die->di_cu_context;
    ret_die->di_is_info = die->di_is_info;

    res =  _dwarf_leb128_uword_wrapper(dbg,&die_info_ptr,
        die_info_end, &utmp,error);
    if (res != DW_DLV_OK) {
        dwarf_dealloc_die(ret_die);
        return res;
    }
    abbrev_code = (Dwarf_Unsigned) utmp;

    dis->de_last_di_ptr = die_info_ptr;

    if (abbrev_code == 0) {
        /* Look for end of sibling chain */
        while (dis->de_last_di_ptr < die_info_end) {
            if (*dis->de_last_di_ptr) {
                break;
            }
            ++dis->de_last_di_ptr;
        }

        /*  We have arrived at a null DIE,
            at the end of a CU or the end
            of a list of siblings. */
        *caller_ret_die = 0;
        dwarf_dealloc(dbg, ret_die, DW_DLA_DIE);
        ret_die = 0;
        return DW_DLV_NO_ENTRY;
    }
    ret_die->di_abbrev_code = abbrev_code;
    lres = _dwarf_get_abbrev_for_code(ret_die->di_cu_context,
        abbrev_code,
        &ret_die->di_abbrev_list,
        &highest_code,error);
    if (lres == DW_DLV_ERROR) {
        dwarf_dealloc(dbg, ret_die, DW_DLA_DIE);
        ret_die = 0;
        return lres;
    }
    if (lres == DW_DLV_NO_ENTRY) {
        dwarfstring m;

        dwarfstring_constructor(&m);
        dwarf_dealloc_die(ret_die);
        ret_die = 0;
        dwarfstring_append_printf_u(&m,
            "DW_DLE_ABBREV_MISSING: the abbrev code not found "
            " in dwarf_child() is %u. ",abbrev_code);
        dwarfstring_append_printf_u(&m,
            "The highest known code"
            " in any compilation unit is %u.",
            highest_code);
        _dwarf_error_string(dbg, error, DW_DLE_ABBREV_MISSING,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
    }
    if (!ret_die->di_abbrev_list->abl_attr) {
        int bres = 0;
        Dwarf_Byte_Ptr abbrev_ptr =
            ret_die->di_abbrev_list->abl_abbrev_ptr;
        Dwarf_Byte_Ptr abbrev_end =
            _dwarf_calculate_abbrev_section_end_ptr(
            ret_die->di_cu_context);
        bres = _dwarf_fill_in_attr_form_abtable(
            ret_die->di_cu_context,
            abbrev_ptr,
            abbrev_end,
            ret_die->di_abbrev_list,
            error);
        if (bres != DW_DLV_OK) {
            dwarf_dealloc_die(ret_die);
            return bres;
        }
    }
    *caller_ret_die = ret_die;
    return DW_DLV_OK;
}